

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_wad.c
# Opt level: O1

void * WAD_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *opaque;
  void *pvVar2;
  PHYSFS_uint32 PVar3;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint32 count;
  PHYSFS_uint32 size;
  PHYSFS_uint32 directoryOffset;
  PHYSFS_uint32 pos;
  PHYSFS_uint8 buf [4];
  PHYSFS_uint32 local_50;
  PHYSFS_uint32 local_4c;
  PHYSFS_uint32 local_48;
  PHYSFS_uint32 local_44;
  int local_3d;
  char local_39 [8];
  undefined1 local_31;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_wad.c"
                  ,0x51,"void *WAD_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&local_3d,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    if ((local_3d == 0x44415749) || (local_3d == 0x44415750)) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&local_50,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      local_50 = PHYSFS_swapULE32(local_50);
      iVar1 = __PHYSFS_readAll(io,&local_48,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      local_48 = PHYSFS_swapULE32(local_48);
      iVar1 = (*io->seek)(io,(PHYSFS_uint64)local_48);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      opaque = UNPK_openArchive(io);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      if (local_50 == 0) {
        return opaque;
      }
      PVar3 = local_50;
      while (((iVar1 = __PHYSFS_readAll(io,&local_44,4), iVar1 != 0 &&
              (iVar1 = __PHYSFS_readAll(io,&local_4c,4), iVar1 != 0)) &&
             (iVar1 = __PHYSFS_readAll(io,local_39,8), iVar1 != 0))) {
        local_31 = 0;
        local_4c = PHYSFS_swapULE32(local_4c);
        local_44 = PHYSFS_swapULE32(local_44);
        pvVar2 = UNPK_addEntry(opaque,local_39,0,-1,-1,(ulong)local_44,(ulong)local_4c);
        if (pvVar2 == (void *)0x0) break;
        PVar3 = PVar3 - 1;
        if (PVar3 == 0) {
          return opaque;
        }
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *WAD_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint32 count;
    PHYSFS_uint32 directoryOffset;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if ((memcmp(buf, "IWAD", 4) != 0) && (memcmp(buf, "PWAD", 4) != 0))
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE32(count);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &directoryOffset, 4), 0);
    directoryOffset = PHYSFS_swapULE32(directoryOffset);

    BAIL_IF_ERRPASS(!io->seek(io, directoryOffset), 0);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!wadLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}